

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H16_merge_sort.c
# Opt level: O2

int main(void)

{
  int i;
  long lVar1;
  uint local_78 [12];
  int arrA [10];
  
  arrA[8] = 0;
  arrA[9] = 6;
  arrA[4] = 8;
  arrA[5] = 1;
  arrA[6] = 2;
  arrA[7] = 9;
  arrA[0] = 5;
  arrA[1] = 7;
  arrA[2] = 3;
  arrA[3] = 4;
  sort(arrA,0,9,(int *)local_78);
  for (lVar1 = 0; lVar1 != 10; lVar1 = lVar1 + 1) {
    printf("%d ",(ulong)local_78[lVar1]);
  }
  return 0;
}

Assistant:

int main() {
  const int n = 10;
  int arrA[n] = {5, 7, 3, 4, 8, 1, 2, 9, 0, 6};
  int arrB[n];
  sort(arrA, 0, n - 1, arrB);

  for (int i = 0; i < n; i++) {
    printf("%d ", arrB[i]);
  }
}